

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImGuiListClipperRange * __thiscall
ImVector<ImGuiListClipperRange>::insert
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *it,ImGuiListClipperRange *v)

{
  bool bVar1;
  ImS8 IVar2;
  ImS8 IVar3;
  undefined1 uVar4;
  int iVar5;
  long lVar6;
  ImGuiListClipperRange *pIVar7;
  ptrdiff_t off;
  ImGuiListClipperRange *v_local;
  ImGuiListClipperRange *it_local;
  ImVector<ImGuiListClipperRange> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.h"
                  ,0x769,
                  "T *ImVector<ImGuiListClipperRange>::insert(const T *, const T &) [T = ImGuiListClipperRange]"
                 );
  }
  lVar6 = ((long)it - (long)this->Data) / 0xc;
  if (this->Size == this->Capacity) {
    iVar5 = _grow_capacity(this,this->Size + 1);
    reserve(this,iVar5);
  }
  if (lVar6 < this->Size) {
    memmove(this->Data + lVar6 + 1,this->Data + lVar6,(this->Size - lVar6) * 0xc);
  }
  pIVar7 = this->Data + lVar6;
  iVar5 = v->Max;
  pIVar7->Min = v->Min;
  pIVar7->Max = iVar5;
  IVar2 = v->PosToIndexOffsetMin;
  IVar3 = v->PosToIndexOffsetMax;
  uVar4 = v->field_0xb;
  pIVar7->PosToIndexConvert = v->PosToIndexConvert;
  pIVar7->PosToIndexOffsetMin = IVar2;
  pIVar7->PosToIndexOffsetMax = IVar3;
  pIVar7->field_0xb = uVar4;
  this->Size = this->Size + 1;
  return this->Data + lVar6;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }